

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char * read_string(Lexer *lexer,CharBuff *buff)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  int flag;
  int chr;
  CharBuff *buff_local;
  Lexer *lexer_local;
  
  bVar1 = false;
  while (uVar3 = read_chr(lexer), uVar3 != 0xc9) {
    if ((uVar3 == 0x27) || (uVar3 == 0x22)) {
      append_chr(buff,(char)uVar3);
      if ((bVar1) && (cVar2 = buff_get(buff,0), uVar3 == (int)cVar2)) break;
      bVar1 = true;
    }
    else {
      append_chr(buff,(char)uVar3);
    }
  }
  if (uVar3 == 0xc9) {
    pcVar4 = to_string(buff);
    lexer_error("String is not closed normally",pcVar4,lexer->row_pos,lexer->col_pos);
  }
  pcVar4 = to_string(buff);
  return pcVar4;
}

Assistant:

char *read_string(Lexer *lexer, CharBuff* buff) {
    int chr;
    int flag = 0;
    while ((chr = read_chr(lexer)) != END) {
        if (chr == '\'' || chr == '"') {
            append_chr(buff, (char) chr);
            if (flag && chr == buff_get(buff, 0)) {
                break;
            }
            flag = 1;
        } else {
            append_chr(buff, (char) chr);
        }
    }
    if (chr == END) {
        lexer_error("String is not closed normally",
                    to_string(buff),
                    lexer->row_pos,
                    lexer->col_pos);
    }
    return to_string(buff);;
}